

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_24::
     IsLegacyJsonFieldConflictEnabled<google::protobuf::EnumOptions>(EnumOptions *options)

{
  bool bVar1;
  EnumOptions *options_local;
  
  bVar1 = EnumOptions::deprecated_legacy_json_field_conflicts(options);
  return bVar1;
}

Assistant:

bool IsLegacyJsonFieldConflictEnabled(const OptionsT& options) {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdeprecated-declarations"
#endif
  return options.deprecated_legacy_json_field_conflicts();
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
}